

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O3

string * __thiscall
soul::CompileMessage::getPositionString_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  LineAndColumn LVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  uint uVar9;
  LineAndColumn LVar10;
  ulong uVar11;
  ulong uVar12;
  string __str;
  ulong *local_88;
  uint local_80;
  undefined4 uStack_7c;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58;
  long lStack_50;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  if ((this->location).location.data == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0:0","");
    return __return_storage_ptr__;
  }
  LVar5 = CodeLocation::getLineAndColumn(&this->location);
  cVar4 = '\x01';
  if (9 < LVar5.line) {
    LVar10 = LVar5;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      uVar9 = LVar10.line;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001af534;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001af534;
      }
      if (uVar9 < 10000) goto LAB_001af534;
      LVar10 = (LineAndColumn)(((ulong)LVar10 & 0xffffffff) / 10000);
      cVar3 = cVar4 + '\x04';
    } while (99999 < uVar9);
    cVar4 = cVar4 + '\x01';
  }
LAB_001af534:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_48,local_40,LVar5.line);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_58 = *puVar8;
    lStack_50 = plVar6[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *puVar8;
    local_68 = (ulong *)*plVar6;
  }
  local_60 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar12 = (ulong)LVar5 >> 0x20;
  cVar4 = '\x01';
  if (4 < LVar5.column >> 1) {
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001af60f;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001af60f;
      }
      if (uVar9 < 10000) goto LAB_001af60f;
      uVar12 = uVar12 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (99999 < uVar9);
    cVar4 = cVar4 + '\x01';
  }
LAB_001af60f:
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88,local_80,LVar5.column);
  uVar12 = CONCAT44(uStack_7c,local_80) + local_60;
  uVar11 = 0xf;
  if (local_68 != &local_58) {
    uVar11 = local_58;
  }
  if (uVar11 < uVar12) {
    uVar11 = 0xf;
    if (local_88 != local_78) {
      uVar11 = local_78[0];
    }
    if (uVar12 <= uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
      goto LAB_001af68b;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
LAB_001af68b:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    uVar2 = puVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getPositionString() const
{
    if (! hasPosition())
        return "0:0";

    auto lc = location.getLineAndColumn();
    return std::to_string (lc.line) + ":" + std::to_string (lc.column);
}